

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeBlocksGenerator::CreateProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs)

{
  const_reference ppcVar1;
  string *psVar2;
  cmAlphaNum local_168;
  cmAlphaNum local_138;
  undefined1 local_108 [8];
  string sessionFilename;
  cmAlphaNum local_b8;
  undefined1 local_88 [8];
  string filename;
  undefined1 local_58 [8];
  string projectName;
  string outputDir;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraCodeBlocksGenerator *this_local;
  
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[](lgs,0);
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(*ppcVar1);
  std::__cxx11::string::string((string *)(projectName.field_2._M_local_buf + 8),(string *)psVar2);
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[](lgs,0);
  cmLocalGenerator::GetProjectName_abi_cxx11_((string *)local_58,*ppcVar1);
  cmAlphaNum::cmAlphaNum(&local_b8,(string *)((long)&projectName.field_2 + 8));
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&sessionFilename.field_2 + 8),'/');
  cmStrCat<std::__cxx11::string,char[5]>
            ((string *)local_88,&local_b8,(cmAlphaNum *)((long)&sessionFilename.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [5])".cbp");
  cmAlphaNum::cmAlphaNum(&local_138,(string *)((long)&projectName.field_2 + 8));
  cmAlphaNum::cmAlphaNum(&local_168,'/');
  cmStrCat<std::__cxx11::string,char[8]>
            ((string *)local_108,&local_138,&local_168,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [8])".layout");
  CreateNewProjectFile(this,lgs,(string *)local_88);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(projectName.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateProjectFile(
  const std::vector<cmLocalGenerator*>& lgs)
{
  std::string outputDir = lgs[0]->GetCurrentBinaryDirectory();
  std::string projectName = lgs[0]->GetProjectName();

  std::string filename = cmStrCat(outputDir, '/', projectName, ".cbp");
  std::string sessionFilename =
    cmStrCat(outputDir, '/', projectName, ".layout");

  this->CreateNewProjectFile(lgs, filename);
}